

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

void __thiscall wirehair::Codec::SetHeavyRows(Codec *this)

{
  uint col_i;
  uint row_i;
  uint8_t *heavy_row;
  uint8_t *heavy_offset;
  Codec *this_local;
  
  heavy_row = this->_heavy_matrix + this->_heavy_pitch * (uint)this->_extra_count;
  for (row_i = 0; row_i < 6; row_i = row_i + 1) {
    for (col_i = 0; col_i < this->_heavy_columns; col_i = col_i + 1) {
      heavy_row[col_i] = kHeavyMatrix[(ulong)col_i + (ulong)row_i * 0x12];
    }
    heavy_row = heavy_row + this->_heavy_pitch;
  }
  return;
}

Assistant:

void Codec::SetHeavyRows()
{
    CAT_IF_DUMP(cout << endl << "---- SetHeavyRows ----" << endl << endl;)

    // Skip extra rows
    uint8_t * GF256_RESTRICT heavy_offset = _heavy_matrix + _heavy_pitch * _extra_count;

    uint8_t * GF256_RESTRICT heavy_row = heavy_offset;

    // For each heavy matrix word:
    for (unsigned row_i = 0; row_i < kHeavyRows; ++row_i, heavy_row += _heavy_pitch)
    {
        // NOTE: Each heavy row is a multiple of 4 bytes in size
        for (unsigned col_i = 0; col_i < _heavy_columns; col_i++) {
            heavy_row[col_i] = kHeavyMatrix[row_i][col_i];
        }
    }

#ifdef CAT_IDENTITY_LOWER_RIGHT
    uint8_t * GF256_RESTRICT lower_right = heavy_offset + _heavy_columns - kHeavyRows;

    // Add identity matrix to tie heavy rows to heavy mixing columns
    for (unsigned ii = 0; ii < kHeavyRows; ++ii, lower_right += _heavy_pitch)
    {
        for (unsigned jj = 0; jj < kHeavyRows; ++jj) {
            lower_right[jj] = (ii == jj) ? 1 : 0;
        }
    }
#endif
}